

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void DLoadSaveMenu::NotifyNewSave(char *file,char *title,bool okForQuicksave)

{
  uint uVar1;
  int iVar2;
  FSaveGameNode **ppFVar3;
  FSaveGameNode *pFVar4;
  int index;
  FSaveGameNode *node_1;
  uint i;
  FSaveGameNode *node;
  bool okForQuicksave_local;
  char *title_local;
  char *file_local;
  
  if (file != (char *)0x0) {
    ReadSaveStrings();
    for (node_1._4_4_ = 0; uVar1 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames),
        node_1._4_4_ < uVar1; node_1._4_4_ = node_1._4_4_ + 1) {
      ppFVar3 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,(ulong)node_1._4_4_)
      ;
      pFVar4 = *ppFVar3;
      iVar2 = FString::Compare(&pFVar4->Filename,file);
      if (iVar2 == 0) {
        strcpy(pFVar4->Title,title);
        pFVar4->bOldVersion = false;
        pFVar4->bMissingWads = false;
        if (!okForQuicksave) {
          return;
        }
        if (quickSaveSlot == (FSaveGameNode *)0x0) {
          quickSaveSlot = pFVar4;
        }
        LastSaved = node_1._4_4_;
        LastAccessed = node_1._4_4_;
        return;
      }
    }
    pFVar4 = (FSaveGameNode *)operator_new(0x28);
    FSaveGameNode::FSaveGameNode(pFVar4);
    strcpy((char *)pFVar4,title);
    FString::operator=(&pFVar4->Filename,file);
    pFVar4->bOldVersion = false;
    pFVar4->bMissingWads = false;
    iVar2 = InsertSaveNode(pFVar4);
    if ((okForQuicksave) &&
       (LastSaved = iVar2, LastAccessed = iVar2, quickSaveSlot == (FSaveGameNode *)0x0)) {
      quickSaveSlot = pFVar4;
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::NotifyNewSave (const char *file, const char *title, bool okForQuicksave)
{
	FSaveGameNode *node;

	if (file == NULL)
		return;

	ReadSaveStrings ();

	// See if the file is already in our list
	for (unsigned i=0; i<SaveGames.Size(); i++)
	{
		FSaveGameNode *node = SaveGames[i];
#ifdef __unix__
		if (node->Filename.Compare (file) == 0)
#else
		if (node->Filename.CompareNoCase (file) == 0)
#endif
		{
			strcpy (node->Title, title);
			node->bOldVersion = false;
			node->bMissingWads = false;
			if (okForQuicksave)
			{
				if (quickSaveSlot == NULL) quickSaveSlot = node;
				LastAccessed = LastSaved = i;
			}
			return;
		}
	}

	node = new FSaveGameNode;
	strcpy (node->Title, title);
	node->Filename = file;
	node->bOldVersion = false;
	node->bMissingWads = false;
	int index = InsertSaveNode (node);

	if (okForQuicksave)
	{
		if (quickSaveSlot == NULL) quickSaveSlot = node;
		LastAccessed = LastSaved = index;
	}
}